

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

char * zng_gzerror(gzFile file,int *errnum)

{
  char *local_30;
  char *local_28;
  gz_state *state;
  int *errnum_local;
  gzFile file_local;
  char *local_8;
  
  if (file == (gzFile)0x0) {
    local_8 = (char *)0x0;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if (errnum != (int *)0x0) {
      *errnum = *(int *)((long)&file[4].pos + 4);
    }
    if (*(int *)((long)&file[4].pos + 4) == -4) {
      local_28 = "out of memory";
    }
    else {
      if (*(long *)(file + 5) == 0) {
        local_30 = "";
      }
      else {
        local_30 = *(char **)(file + 5);
      }
      local_28 = local_30;
    }
    local_8 = local_28;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char * Z_EXPORT PREFIX(gzerror)(gzFile file, int *errnum) {
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->err == Z_MEM_ERROR ? "out of memory" : (state->msg == NULL ? "" : state->msg);
}